

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_0::initSubmitInfo
               (VkSubmitInfo *submitInfo,deUint32 submitInfoCount)

{
  uint local_18;
  deUint32 ndx;
  deUint32 submitInfoCount_local;
  VkSubmitInfo *submitInfo_local;
  
  for (local_18 = 0; local_18 < submitInfoCount; local_18 = local_18 + 1) {
    submitInfo[local_18].sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfo[local_18].pNext = (void *)0x0;
    submitInfo[local_18].waitSemaphoreCount = 0;
    submitInfo[local_18].pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfo[local_18].pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submitInfo[local_18].commandBufferCount = 1;
    submitInfo[local_18].signalSemaphoreCount = 0;
    submitInfo[local_18].pSignalSemaphores = (VkSemaphore *)0x0;
  }
  return;
}

Assistant:

static void initSubmitInfo (VkSubmitInfo* submitInfo, deUint32 submitInfoCount)
{
	for (deUint32 ndx = 0; ndx < submitInfoCount; ndx++)
	{
		submitInfo[ndx].sType					= VK_STRUCTURE_TYPE_SUBMIT_INFO;
		submitInfo[ndx].pNext					= DE_NULL;
		submitInfo[ndx].waitSemaphoreCount		= 0;
		submitInfo[ndx].pWaitSemaphores			= DE_NULL;
		submitInfo[ndx].pWaitDstStageMask		= DE_NULL;
		submitInfo[ndx].commandBufferCount		= 1;
		submitInfo[ndx].signalSemaphoreCount	= 0;
		submitInfo[ndx].pSignalSemaphores		= DE_NULL;
	}
}